

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

bool __thiscall QWidgetPrivate::handleClose(QWidgetPrivate *this,CloseMode mode)

{
  undefined1 *puVar1;
  uint uVar2;
  QObject *pQVar3;
  QDebug this_00;
  QWidgetPrivate *d;
  int *piVar4;
  bool bVar5;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 uStack_78;
  undefined4 local_74;
  char *local_70;
  QDebug local_68;
  QTextStream *local_60;
  undefined1 local_58 [8];
  QArrayData *local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = *(QObject **)&this->field_0x8;
  QtPrivateLogging::lcWidgetShowHide();
  if (((byte)QtPrivateLogging::lcWidgetShowHide::category.field_2.bools.enabledDebug._q_value.
             _M_base._M_i & 1) != 0) {
    local_88 = 2;
    uStack_84 = 0;
    uStack_80 = 0;
    uStack_7c = 0;
    uStack_78 = 0;
    local_74 = 0;
    local_70 = QtPrivateLogging::lcWidgetShowHide::category.name;
    QMessageLogger::debug();
    this_00.stream = local_68.stream;
    QVar6.m_data = (storage_type *)0x18;
    QVar6.m_size = (qsizetype)local_50;
    QString::fromUtf8(QVar6);
    QTextStream::operator<<((QTextStream *)this_00.stream,(QString *)local_50);
    if (local_50[0] != (QArrayData *)0x0) {
      LOCK();
      (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50[0],2,0x10);
      }
    }
    if (*(QTextStream *)(local_68.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_68.stream,' ');
    }
    local_60 = (QTextStream *)local_68.stream;
    *(int *)(local_68.stream + 0x28) = *(int *)(local_68.stream + 0x28) + 1;
    ::operator<<((Stream *)local_58,(QWidget *)&local_60);
    QDebug::~QDebug((QDebug *)local_58);
    QDebug::~QDebug((QDebug *)&local_60);
    QDebug::~QDebug(&local_68);
  }
  uVar2 = *(uint *)&(this->data).field_0x10;
  bVar5 = true;
  if ((uVar2 >> 9 & 1) != 0) goto LAB_0030b825;
  *(uint *)&(this->data).field_0x10 = uVar2 | 0x200;
  if (pQVar3 == (QObject *)0x0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(pQVar3);
  }
  if ((mode == CloseNoEvent) || ((*(uint *)&(this->data).field_0x10 & 0x40000) != 0)) {
LAB_0030b795:
    bVar5 = true;
    if (piVar4 != (int *)0x0) {
      if (((pQVar3 != (QObject *)0x0) && (piVar4[1] != 0)) &&
         ((*(byte *)(*(long *)(pQVar3 + 0x20) + 10) & 1) == 0)) {
        (**(code **)(*(long *)pQVar3 + 0x68))(pQVar3,0);
      }
      if (((piVar4 != (int *)0x0) && (pQVar3 != (QObject *)0x0)) && (piVar4[1] != 0)) {
        puVar1 = &(this->data).field_0x11;
        *puVar1 = *puVar1 & 0xfd;
        uVar2 = *(uint *)(*(long *)(pQVar3 + 8) + 0x240);
        if ((uVar2 >> 0x17 & 1) != 0) {
          *(uint *)(*(long *)(pQVar3 + 8) + 0x240) = uVar2 & 0xff7fffff;
          QObject::deleteLater();
        }
      }
    }
  }
  else {
    local_88 = 0xaaaaaaaa;
    uStack_84 = 0xaaaaaaaa;
    uStack_80 = 0xaaaaaaaa;
    uStack_7c = 0xaaaaaaaa;
    QCloseEvent::QCloseEvent((QCloseEvent *)&local_88);
    if (mode == CloseWithSpontaneousEvent) {
      QCoreApplication::sendSpontaneousEvent(pQVar3,(QEvent *)&local_88);
    }
    else {
      QCoreApplication::sendEvent(pQVar3,(QEvent *)&local_88);
    }
    if ((((piVar4 == (int *)0x0) || (pQVar3 == (QObject *)0x0)) || (piVar4[1] == 0)) ||
       ((char)uStack_7c != '\0')) {
      QCloseEvent::~QCloseEvent((QCloseEvent *)&local_88);
      goto LAB_0030b795;
    }
    puVar1 = &(this->data).field_0x11;
    *puVar1 = *puVar1 & 0xfd;
    QCloseEvent::~QCloseEvent((QCloseEvent *)&local_88);
    bVar5 = false;
  }
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      operator_delete(piVar4);
    }
  }
LAB_0030b825:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool QWidgetPrivate::handleClose(CloseMode mode)
{
    Q_Q(QWidget);
    qCDebug(lcWidgetShowHide) << "Handling close event for" << q;

    if (data.is_closing)
        return true;

    // We might not have initiated the close, so update the state now that we know
    data.is_closing = true;

    QPointer<QWidget> that = q;

    if (data.in_destructor)
        mode = CloseNoEvent;

    if (mode != CloseNoEvent) {
        QCloseEvent e;
        if (mode == CloseWithSpontaneousEvent)
            QApplication::sendSpontaneousEvent(q, &e);
        else
            QCoreApplication::sendEvent(q, &e);
        if (!that.isNull() && !e.isAccepted()) {
            data.is_closing = false;
            return false;
        }
    }

    // even for windows, make sure we deliver a hide event and that all children get hidden
    if (!that.isNull() && !q->isHidden())
        q->hide();

    if (!that.isNull()) {
        data.is_closing = false;
        if (q->testAttribute(Qt::WA_DeleteOnClose)) {
            q->setAttribute(Qt::WA_DeleteOnClose, false);
            q->deleteLater();
        }
    }
    return true;
}